

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_probe_guess(stb_search *s,int *result)

{
  int iVar1;
  int *result_local;
  stb_search *s_local;
  
  iVar1 = s->mode;
  if (iVar1 == 0) {
    if (s->minval == s->maxval) {
      *result = s->minval;
      return 0;
    }
    if (s->maxval <= s->minval) {
      __assert_fail("s->minval < s->maxval",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x688,"int stb_probe_guess(stb_search *, int *)");
    }
    s->guess = s->minval + ((uint)(s->maxval - s->minval) >> 1);
  }
  else if (iVar1 == 1) {
    if (s->minval == s->maxval) {
      *result = s->minval;
      return 0;
    }
    if (s->maxval <= s->minval) {
      __assert_fail("s->minval < s->maxval",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x67e,"int stb_probe_guess(stb_search *, int *)");
    }
    s->guess = s->minval + ((s->maxval - s->minval) + 1U >> 1);
  }
  else if (iVar1 - 2U < 2) {
    s->guess = s->maxval;
  }
  *result = s->guess;
  return 1;
}

Assistant:

static int stb_probe_guess(stb_search *s, int *result)
{
   switch(s->mode) {
      case STB_probe_binary_largest:
         if (s->minval == s->maxval) {
            *result = s->minval;
            return 0;
         }
         assert(s->minval < s->maxval);
         // if a < b, then a < p <= b
         s->guess = s->minval + (((unsigned) s->maxval - s->minval + 1) >> 1);
         break;

      case STB_probe_binary_smallest:
         if (s->minval == s->maxval) {
            *result = s->minval;
            return 0;
         }
         assert(s->minval < s->maxval);
         // if a < b, then a <= p < b
         s->guess = s->minval + (((unsigned) s->maxval - s->minval) >> 1);
         break;
      case STB_probe_open_smallest:
      case STB_probe_open_largest:
         s->guess = s->maxval;  // guess the current maxval
         break;
   }
   *result = s->guess;
   return 1;
}